

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O0

void __thiscall QFontComboBoxPrivate::currentChanged(QFontComboBoxPrivate *this,QString *text)

{
  initializer_list<QString> args;
  bool bVar1;
  QFontComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QFontComboBox *q;
  QStringList families;
  QFont *in_stack_ffffffffffffff58;
  QList<QString> *in_stack_ffffffffffffff60;
  QPaintDevice *this_00;
  QFont *this_01;
  iterator in_stack_ffffffffffffff70;
  QFontComboBox *pQVar2;
  size_type in_stack_ffffffffffffff78;
  undefined1 local_20 [32];
  
  local_20._24_8_ = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QFont::families();
  bVar1 = QList<QString>::isEmpty((QList<QString> *)0x59a0f1);
  if (!bVar1) {
    QList<QString>::first(in_stack_ffffffffffffff60);
    bVar1 = ::operator!=((QString *)in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
    if (!bVar1) goto LAB_0059a1cd;
  }
  this_01 = &in_RDI->currentFont;
  QString::QString((QString *)in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
  args._M_len = in_stack_ffffffffffffff78;
  args._M_array = in_stack_ffffffffffffff70;
  QList<QString>::QList((QList<QString> *)this_01,args);
  QFont::setFamilies((QList_conflict2 *)this_01);
  QList<QString>::~QList((QList<QString> *)0x59a17a);
  pQVar2 = (QFontComboBox *)local_20;
  this_00 = (QPaintDevice *)(local_20 + 0x18);
  do {
    this_00 = &(((QFontComboBox *)((long)this_00 + -0x28))->super_QComboBox).super_QWidget.
               super_QPaintDevice;
    QString::~QString((QString *)0x59a1a3);
  } while (this_00 != (QPaintDevice *)pQVar2);
  QFontComboBox::currentFontChanged((QFontComboBox *)this_00,in_stack_ffffffffffffff58);
LAB_0059a1cd:
  QList<QString>::~QList((QList<QString> *)0x59a1d7);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20._24_8_) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontComboBoxPrivate::currentChanged(const QString &text)
{
    Q_Q(QFontComboBox);
    const QStringList families = currentFont.families();
    if (families.isEmpty() || families.first() != text) {
        currentFont.setFamilies(QStringList{text});
        emit q->currentFontChanged(currentFont);
    }
}